

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  istream *piVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  mapped_type *this;
  ulong uVar7;
  pointer ppVar8;
  iterator local_150;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  iterator local_140;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  const_iterator i_2;
  string ext;
  size_t pos;
  string local_e8 [8];
  string filename;
  int local_c4;
  int i_1;
  string local_90 [8];
  string mime;
  string local_70 [8];
  string type;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mime_types;
  int local_10;
  int files;
  int types;
  
  files = 0;
  std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::ignore();
  std::istream::operator>>
            ((istream *)&std::cin,
             (int *)((long)&mime_types._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  std::istream::ignore();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_10);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,mime_types._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_48);
  for (local_4c = 0; local_4c < local_10; local_4c = local_4c + 1) {
    std::__cxx11::string::string(local_70);
    std::__cxx11::string::string(local_90);
    piVar3 = std::operator>>((istream *)&std::cin,local_70);
    std::operator>>(piVar3,local_90);
    std::istream::ignore();
    poVar2 = std::operator<<((ostream *)&std::cerr,"type: ");
    poVar2 = std::operator<<(poVar2,local_70);
    poVar2 = std::operator<<(poVar2,", mime: ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    _Var4._M_current = (char *)std::__cxx11::string::begin();
    _Var5._M_current = (char *)std::__cxx11::string::end();
    _Var6._M_current = (char *)std::__cxx11::string::begin();
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (_Var4,_Var5,_Var6,tolower);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_48,(key_type *)local_70);
    std::__cxx11::string::operator=((string *)this,local_90);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_70);
  }
  for (local_c4 = 0; local_c4 < mime_types._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      local_c4 = local_c4 + 1) {
    std::__cxx11::string::string(local_e8);
    std::operator>>((istream *)&std::cin,local_e8);
    std::istream::ignore();
    _Var4._M_current = (char *)std::__cxx11::string::begin();
    _Var5._M_current = (char *)std::__cxx11::string::end();
    _Var6._M_current = (char *)std::__cxx11::string::begin();
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (_Var4,_Var5,_Var6,tolower);
    uVar7 = std::__cxx11::string::rfind((char)local_e8,0x2e);
    poVar2 = std::operator<<((ostream *)&std::cerr,"file #");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c4);
    poVar2 = std::operator<<(poVar2,". ");
    poVar2 = std::operator<<(poVar2,local_e8);
    poVar2 = std::operator<<(poVar2,"; rpos = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar7);
    poVar2 = std::operator<<(poVar2,", npos = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xffffffffffffffff);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (uVar7 == 0xffffffffffffffff) {
      poVar2 = std::operator<<((ostream *)&std::cout,"UNKNOWN");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::__cxx11::string::substr((ulong)&i_2,(ulong)local_e8);
      local_140._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_48,(key_type *)&i_2);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_138,&local_140);
      local_150._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_48);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_148,&local_150);
      bVar1 = std::operator==(&local_148,&local_138);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"UNKNOWN");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        ppVar8 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_138);
        poVar2 = std::operator<<((ostream *)&std::cout,(string *)&ppVar8->second);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::~string((string *)&i_2);
    }
    std::__cxx11::string::~string(local_e8);
  }
  files = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_48);
  return files;
}

Assistant:

int main()
{
	int types, files;
	cin >> types; cin.ignore();
	cin >> files; cin.ignore();
	
	std::cerr << types << ", " << files << std::endl;
	
	std::map<std::string, std::string> mime_types;
	for (int i = 0; i < types; i++)
	{
	    std::string type;
	    std::string mime;
		std::cin >> type >> mime;
		std::cin.ignore();
		
		std::cerr << "type: " << type << ", mime: " << mime << std::endl;
		std::transform(type.begin(), type.end(), type.begin(), ::tolower);
		mime_types[type] = mime;
	}
	
	for (int i = 0; i < files; i++)
	{
	    std::string filename;
	    std::cin >> filename;
	    std::cin.ignore();
	    std::transform(filename.begin(), filename.end(), filename.begin(), ::tolower);
	    size_t pos = filename.rfind('.');
	    std::cerr << "file #" << i << ". " << filename << "; rpos = " << pos << ", npos = " << std::string::npos << std::endl;
	    
	    if (std::string::npos != pos)
	    {
	        std::string ext = filename.substr(pos + 1);
	        //std::cerr << pos << ", " << ext <<  std::endl;
	        std::map<std::string, std::string>::const_iterator i = mime_types.find(ext);
	        if (mime_types.end() == i)
	        {
	            std::cout << "UNKNOWN" << std::endl;
	        } else
	        {
	            std::cout << i->second << std::endl;
	        }
	    } else
	    {
	        std::cout << "UNKNOWN" << std::endl;
	    }
	}
	
	return 0;
}